

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O0

void __thiscall vera::Vbo::addVertices(Vbo *this,GLbyte *_vertices,int _nVertices)

{
  GLint GVar1;
  ostream *this_00;
  __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_> local_30
  ;
  const_iterator local_28;
  int local_20;
  int local_1c;
  int vertexBytes;
  int _nVertices_local;
  GLbyte *_vertices_local;
  Vbo *this_local;
  
  local_1c = _nVertices;
  _vertexBytes = _vertices;
  _vertices_local = (GLbyte *)this;
  if ((this->m_isUploaded & 1U) == 0) {
    GVar1 = VertexLayout::getStride(this->m_vertexLayout);
    local_20 = GVar1 * local_1c;
    local_30._M_current =
         (char *)std::vector<signed_char,_std::allocator<signed_char>_>::end(&this->m_vertexData);
    __gnu_cxx::
    __normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>::
    __normal_iterator<signed_char*>
              ((__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>
                *)&local_28,&local_30);
    std::vector<signed_char,std::allocator<signed_char>>::insert<signed_char*,void>
              ((vector<signed_char,std::allocator<signed_char>> *)&this->m_vertexData,local_28,
               _vertexBytes,_vertexBytes + local_20);
    this->m_nVertices = local_1c + this->m_nVertices;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"Vbo cannot add vertices after upload!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Vbo::addVertices(GLbyte* _vertices, int _nVertices) {
    if (m_isUploaded) {
        std::cout << "Vbo cannot add vertices after upload!" << std::endl;
        return;
    }

    // // Only add up to 65535 vertices, any more will overflow our 16-bit indices
    // int indexSpace = MAX_INDEX_VALUE - m_nVertices;
    // if (_nVertices > indexSpace) {
    //     _nVertices = indexSpace;
    //     std::cout << "WARNING: Tried to add more vertices than available in index space" << std::endl;
    // }

    int vertexBytes = m_vertexLayout->getStride() * _nVertices;
    m_vertexData.insert(m_vertexData.end(), _vertices, _vertices + vertexBytes);
    m_nVertices += _nVertices;
}